

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O2

void __thiscall
PSVIWriterHandlers::writeEmpty(PSVIWriterHandlers *this,XMLCh *elementName,StringList *attrs)

{
  ulong uVar1;
  XMLFormatter *pXVar2;
  char16_t *pcVar3;
  uint uVar4;
  
  pXVar2 = this->fFormatter;
  *(undefined4 *)pXVar2 = 0;
  pXVar2 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar2,this->fIndentChars);
  pXVar2 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar2,L'<');
  xercesc_4_0::XMLFormatter::operator<<(pXVar2,elementName);
  uVar4 = 1;
  while( true ) {
    uVar1 = (attrs->super_BaseRefVectorOf<char16_t>).fCurCount;
    pXVar2 = this->fFormatter;
    *(undefined4 *)pXVar2 = 0;
    if (uVar1 <= uVar4 - 1) break;
    pXVar2 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar2,L' ');
    pcVar3 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                       (&attrs->super_BaseRefVectorOf<char16_t>,(ulong)(uVar4 - 1));
    pXVar2 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar2,pcVar3);
    pXVar2 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar2,L"=\"");
    *(undefined4 *)pXVar2 = 2;
    pcVar3 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                       (&attrs->super_BaseRefVectorOf<char16_t>,(ulong)uVar4);
    pXVar2 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar2,pcVar3);
    *(undefined4 *)pXVar2 = 0;
    xercesc_4_0::XMLFormatter::operator<<(pXVar2,L'\"');
    uVar4 = uVar4 + 2;
  }
  xercesc_4_0::XMLFormatter::operator<<(pXVar2,L"/>\n");
  return;
}

Assistant:

void PSVIWriterHandlers::writeEmpty(const XMLCh* const elementName, const StringList* const attrs) {
	*fFormatter
		<< XMLFormatter::NoEscapes << fIndentChars << chOpenAngle << elementName ;
	for (unsigned int i=0; i < attrs->size(); i+=2 ) {
		*fFormatter
			<< XMLFormatter::NoEscapes << chSpace << attrs->elementAt(i) << gEqualsQuote
			<< XMLFormatter::AttrEscapes << attrs->elementAt(i+1)
			<< XMLFormatter::NoEscapes << chDoubleQuote ;
	}
	*fFormatter
		<< XMLFormatter::NoEscapes << gSlashAngleFeed ;
}